

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepTiledBasic.cpp
# Opt level: O2

void anon_unknown.dwarf_108279::readFile
               (int channelCount,bool bulkRead,bool relativeCoords,bool randomChannels,
               string *filename)

{
  LineOrder LVar1;
  Compression CVar2;
  PixelType PVar3;
  bool bVar4;
  __type _Var5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Header *this;
  Box2i *pBVar11;
  Box2i *pBVar12;
  float *pfVar13;
  V2f *pVVar14;
  V2f *pVVar15;
  LineOrder *pLVar16;
  Compression *pCVar17;
  ChannelList *this_00;
  ChannelList *other;
  string *__lhs;
  string *__rhs;
  TileDescription *this_01;
  TileDescription *other_00;
  ulong uVar18;
  ostream *poVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  void *pvVar23;
  long lVar24;
  long lVar25;
  void **ppvVar26;
  int iVar27;
  char *pcVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  int i;
  ulong uVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  PixelType t;
  long lVar38;
  int iVar39;
  char *pcVar40;
  int iVar41;
  size_t spst;
  undefined1 xtc;
  undefined8 in_R10;
  int k;
  ulong uVar42;
  int j;
  uint uVar43;
  long lVar44;
  long lVar45;
  int iVar46;
  float fVar47;
  float fVar48;
  int local_34c;
  long local_348;
  Array<Imf_2_5::Array2D<void_*>_> data;
  int local_310;
  Array2D<unsigned_int> localSampleCount;
  DeepTiledInputFile file;
  Box2i box;
  vector<int,_std::allocator<int>_> read_channel;
  string str;
  DeepFrameBuffer frameBuffer;
  stringstream ss;
  int local_1b4;
  undefined1 local_1a8 [376];
  
  if (bulkRead && relativeCoords) {
    __assert_fail("bulkRead == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1a3,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  std::operator<<((ostream *)&std::cout,"reading ");
  std::ostream::flush();
  Imf_2_5::DeepTiledInputFile::DeepTiledInputFile(&file,(filename->_M_dataplus)._M_p,4);
  this = Imf_2_5::DeepTiledInputFile::header(&file);
  pBVar11 = Imf_2_5::Header::displayWindow(this);
  pBVar12 = Imf_2_5::Header::displayWindow((Header *)(anonymous_namespace)::header);
  bVar4 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar11,pBVar12);
  if (!bVar4) {
    __assert_fail("fileHeader.displayWindow() == header.displayWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1aa,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pBVar11 = Imf_2_5::Header::dataWindow(this);
  pBVar12 = Imf_2_5::Header::dataWindow((Header *)(anonymous_namespace)::header);
  bVar4 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar11,pBVar12);
  if (!bVar4) {
    __assert_fail("fileHeader.dataWindow() == header.dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1ab,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pfVar13 = Imf_2_5::Header::pixelAspectRatio(this);
  fVar48 = *pfVar13;
  pfVar13 = Imf_2_5::Header::pixelAspectRatio((Header *)(anonymous_namespace)::header);
  if ((fVar48 != *pfVar13) || (NAN(fVar48) || NAN(*pfVar13))) {
    __assert_fail("fileHeader.pixelAspectRatio() == header.pixelAspectRatio()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1ac,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pVVar14 = Imf_2_5::Header::screenWindowCenter(this);
  pVVar15 = Imf_2_5::Header::screenWindowCenter((Header *)(anonymous_namespace)::header);
  if ((((pVVar14->x != pVVar15->x) || (NAN(pVVar14->x) || NAN(pVVar15->x))) ||
      (pVVar14->y != pVVar15->y)) || (NAN(pVVar14->y) || NAN(pVVar15->y))) {
    __assert_fail("fileHeader.screenWindowCenter() == header.screenWindowCenter()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1ad,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pfVar13 = Imf_2_5::Header::screenWindowWidth(this);
  fVar48 = *pfVar13;
  pfVar13 = Imf_2_5::Header::screenWindowWidth((Header *)(anonymous_namespace)::header);
  if ((fVar48 != *pfVar13) || (NAN(fVar48) || NAN(*pfVar13))) {
    __assert_fail("fileHeader.screenWindowWidth() == header.screenWindowWidth()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1ae,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pLVar16 = Imf_2_5::Header::lineOrder(this);
  LVar1 = *pLVar16;
  pLVar16 = Imf_2_5::Header::lineOrder((Header *)(anonymous_namespace)::header);
  if (LVar1 != *pLVar16) {
    __assert_fail("fileHeader.lineOrder() == header.lineOrder()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1af,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pCVar17 = Imf_2_5::Header::compression(this);
  CVar2 = *pCVar17;
  pCVar17 = Imf_2_5::Header::compression((Header *)(anonymous_namespace)::header);
  if (CVar2 != *pCVar17) {
    __assert_fail("fileHeader.compression() == header.compression()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1b0,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  this_00 = Imf_2_5::Header::channels(this);
  other = Imf_2_5::Header::channels((Header *)(anonymous_namespace)::header);
  bVar4 = Imf_2_5::ChannelList::operator==(this_00,other);
  if (!bVar4) {
    __assert_fail("fileHeader.channels() == header.channels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1b1,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  __lhs = Imf_2_5::Header::type_abi_cxx11_(this);
  __rhs = Imf_2_5::Header::type_abi_cxx11_((Header *)(anonymous_namespace)::header);
  _Var5 = std::operator==(__lhs,__rhs);
  if (!_Var5) {
    __assert_fail("fileHeader.type() == header.type()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1b2,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  this_01 = Imf_2_5::Header::tileDescription(this);
  other_00 = Imf_2_5::Header::tileDescription((Header *)(anonymous_namespace)::header);
  bVar4 = Imf_2_5::TileDescription::operator==(this_01,other_00);
  if (!bVar4) {
    __assert_fail("fileHeader.tileDescription() == header.tileDescription()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1b3,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  localSampleCount._sizeX = 0;
  localSampleCount._sizeY = 0;
  localSampleCount._data = (uint *)0x0;
  Imf_2_5::Array2D<unsigned_int>::resizeErase(&localSampleCount,0xa9,0x111);
  uVar6 = random_int(3);
  uVar43 = uVar6 + channelCount;
  Imf_2_5::Array<Imf_2_5::Array2D<void_*>_>::Array(&data,(long)(int)uVar43);
  uVar34 = 0;
  uVar18 = (ulong)uVar43;
  if ((int)uVar43 < 1) {
    uVar18 = uVar34;
  }
  for (; xtc = (undefined1)in_R10, uVar18 * 0x18 - uVar34 != 0; uVar34 = uVar34 + 0x18) {
    Imf_2_5::Array2D<void_*>::resizeErase
              ((Array2D<void_*> *)((long)&(data._data)->_sizeX + uVar34),0xa9,0x111);
  }
  Imf_2_5::DeepFrameBuffer::DeepFrameBuffer(&frameBuffer);
  if (relativeCoords) {
    lVar38 = 0;
  }
  else {
    lVar38 = (long)DAT_004236b4 * 0x111 + (long)(anonymous_namespace)::dataWindow;
  }
  Imf_2_5::Slice::Slice
            ((Slice *)&ss,UINT,(char *)(localSampleCount._data + -lVar38),4,0x444,1,1,0.0,(bool)xtc,
             relativeCoords);
  Imf_2_5::DeepFrameBuffer::insertSampleCountSlice(&frameBuffer,(Slice *)&ss);
  std::vector<int,_std::allocator<int>_>::vector
            (&read_channel,(ulong)(uint)channelCount,(allocator_type *)&ss);
  uVar34 = 0;
  uVar18 = 0;
  if (0 < channelCount) {
    uVar18 = (ulong)(uint)channelCount;
  }
  lVar35 = 0x10;
  iVar46 = 0;
  do {
    if (uVar18 == uVar34) {
      if (iVar46 == 0) {
        std::operator<<((ostream *)&std::cout,"skipping ");
        std::ostream::flush();
      }
      else {
        uVar42 = 0;
        uVar34 = (ulong)uVar6;
        if ((int)uVar6 < 1) {
          uVar34 = uVar42;
        }
        lVar35 = (long)channelCount * 0x18;
        for (; uVar34 != uVar42; uVar42 = uVar42 + 1) {
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          poVar19 = (ostream *)std::ostream::operator<<(local_1a8,(int)uVar42);
          std::operator<<(poVar19,"fill");
          std::__cxx11::stringbuf::str();
          Imf_2_5::DeepSlice::DeepSlice
                    ((DeepSlice *)&box,FLOAT,
                     (char *)(*(long *)((long)&(data._data)->_data + lVar35) + lVar38 * -8),8,0x888,
                     4,1,1,0.0,relativeCoords,relativeCoords);
          Imf_2_5::DeepFrameBuffer::insert(&frameBuffer,&str,(DeepSlice *)&box);
          std::__cxx11::string::~string((string *)&str);
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          lVar35 = lVar35 + 0x18;
        }
        Imf_2_5::DeepTiledInputFile::setFrameBuffer(&file,&frameBuffer);
        pcVar28 = "per-tile ";
        if (relativeCoords) {
          pcVar28 = "per-tile with relative coordinates ";
        }
        pcVar40 = "bulk ";
        if (!bulkRead) {
          pcVar40 = pcVar28;
        }
        std::operator<<((ostream *)&std::cout,pcVar40);
        std::ostream::flush();
        lVar38 = uVar34 * 0x18;
        for (local_348 = 0; iVar46 = Imf_2_5::DeepTiledInputFile::numYLevels(&file),
            local_348 < iVar46; local_348 = local_348 + 1) {
          lVar35 = 0;
          while( true ) {
            iVar46 = Imf_2_5::DeepTiledInputFile::numXLevels(&file);
            if (iVar46 <= lVar35) break;
            iVar7 = (int)lVar35;
            Imf_2_5::DeepTiledInputFile::dataWindowForLevel
                      ((DeepTiledInputFile *)&ss,(int)&file,iVar7);
            iVar46 = (int)local_348;
            if (bulkRead) {
              iVar8 = Imf_2_5::DeepTiledInputFile::numXTiles(&file,iVar7);
              iVar9 = Imf_2_5::DeepTiledInputFile::numYTiles(&file,iVar46);
              Imf_2_5::DeepTiledInputFile::readPixelSampleCounts
                        (&file,0,iVar8 + -1,0,iVar9 + -1,iVar7,iVar46);
              local_34c = 0;
              while( true ) {
                iVar8 = Imf_2_5::DeepTiledInputFile::numYTiles(&file,iVar46);
                if (iVar8 <= local_34c) break;
                iVar8 = 0;
                while( true ) {
                  iVar9 = Imf_2_5::DeepTiledInputFile::numXTiles(&file,iVar7);
                  if (iVar9 <= iVar8) break;
                  Imf_2_5::DeepTiledInputFile::dataWindowForTile
                            ((DeepTiledInputFile *)&box,(int)&file,iVar8,local_34c,iVar7);
                  iVar9 = box.max.y;
                  lVar29 = (long)box.min.x;
                  lVar30 = (long)box.max.x;
                  for (iVar10 = box.min.y; iVar10 <= iVar9; iVar10 = iVar10 + 1) {
                    lVar44 = (long)iVar10 - (long)local_1b4;
                    lVar20 = (long)(int)_ss;
                    lVar21 = localSampleCount._sizeY * lVar44;
                    lVar22 = DAT_004236f0 * local_348;
                    for (lVar24 = lVar29; lVar24 <= lVar30; lVar24 = lVar24 + 1) {
                      lVar36 = lVar24 - lVar20;
                      lVar31 = _DAT_004236f8 + lVar22 * 0x18;
                      if (localSampleCount._data[lVar21 + lVar36] !=
                          *(uint *)(*(long *)(lVar35 * 0x18 + 8 + lVar31) * lVar44 * 4 +
                                    *(long *)(lVar35 * 0x18 + 0x10 + lVar31) + lVar36 * 4)) {
                        __assert_fail("localSampleCount[dwy][dwx] == sampleCountWhole[ly][lx][dwy][dwx]"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                                      ,0x238,
                                      "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                     );
                      }
                      lVar31 = 4;
                      lVar37 = (anonymous_namespace)::channelTypes;
                      for (uVar34 = 0; uVar34 < (ulong)(DAT_004236d8 - lVar37 >> 2);
                          uVar34 = uVar34 + 1) {
                        iVar32 = *(int *)(lVar37 + uVar34 * 4);
                        if (iVar32 == 0) {
                          pvVar23 = operator_new__((ulong)localSampleCount._data[lVar21 + lVar36] <<
                                                   2);
                          *(void **)(*(long *)((long)data._data + lVar31 * 4 + -8) * lVar44 * 8 +
                                     *(long *)((long)&(data._data)->_sizeX + lVar31 * 4) +
                                    lVar36 * 8) = pvVar23;
                          iVar32 = *(int *)((anonymous_namespace)::channelTypes + uVar34 * 4);
                          lVar37 = (anonymous_namespace)::channelTypes;
                        }
                        if (iVar32 == 1) {
                          pvVar23 = operator_new__((ulong)localSampleCount._data[lVar21 + lVar36] *
                                                   2);
                          *(void **)(*(long *)((long)data._data + lVar31 * 4 + -8) * lVar44 * 8 +
                                     *(long *)((long)&(data._data)->_sizeX + lVar31 * 4) +
                                    lVar36 * 8) = pvVar23;
                          iVar32 = *(int *)((anonymous_namespace)::channelTypes + uVar34 * 4);
                          lVar37 = (anonymous_namespace)::channelTypes;
                        }
                        if (iVar32 == 2) {
                          pvVar23 = operator_new__((ulong)localSampleCount._data[lVar21 + lVar36] <<
                                                   2);
                          *(void **)(*(long *)((long)data._data + lVar31 * 4 + -8) * lVar44 * 8 +
                                     *(long *)((long)&(data._data)->_sizeX + lVar31 * 4) +
                                    lVar36 * 8) = pvVar23;
                          lVar37 = (anonymous_namespace)::channelTypes;
                        }
                        lVar31 = lVar31 + 6;
                      }
                      for (lVar31 = 0; lVar38 - lVar31 != 0; lVar31 = lVar31 + 0x18) {
                        pvVar23 = operator_new__((ulong)localSampleCount._data[lVar21 + lVar36] << 2
                                                );
                        uVar34 = (ulong)(DAT_004236d8 - (anonymous_namespace)::channelTypes) >> 2;
                        *(void **)(*(long *)((long)&data._data[uVar34]._sizeY + lVar31) * lVar44 * 8
                                   + *(long *)((long)&data._data[uVar34]._data + lVar31) +
                                  lVar36 * 8) = pvVar23;
                      }
                    }
                  }
                  iVar8 = iVar8 + 1;
                }
                local_34c = local_34c + 1;
              }
              iVar8 = Imf_2_5::DeepTiledInputFile::numXTiles(&file,iVar7);
              iVar9 = Imf_2_5::DeepTiledInputFile::numYTiles(&file,iVar46);
              Imf_2_5::DeepTiledInputFile::readTiles(&file,0,iVar8 + -1,0,iVar9 + -1,iVar7,iVar46);
            }
            else if (relativeCoords) {
              for (local_310 = 0; iVar8 = Imf_2_5::DeepTiledInputFile::numYTiles(&file,iVar46),
                  local_310 < iVar8; local_310 = local_310 + 1) {
                iVar8 = 0;
                while( true ) {
                  iVar9 = Imf_2_5::DeepTiledInputFile::numXTiles(&file,iVar7);
                  if (iVar9 <= iVar8) break;
                  Imf_2_5::DeepTiledInputFile::readPixelSampleCount
                            (&file,iVar8,local_310,iVar7,iVar46);
                  Imf_2_5::DeepTiledInputFile::dataWindowForTile
                            ((DeepTiledInputFile *)&box,(int)&file,iVar8,local_310,iVar7);
                  lVar24 = (long)box.max.y;
                  lVar20 = (long)box.min.x;
                  lVar21 = (long)box.max.x;
                  lVar30 = (long)box.min.y;
                  for (lVar29 = lVar30; lVar29 <= lVar24; lVar29 = lVar29 + 1) {
                    lVar44 = (long)(int)_ss;
                    lVar37 = lVar29 - lVar30;
                    lVar31 = localSampleCount._sizeY * lVar37;
                    lVar36 = DAT_004236f0 * local_348;
                    for (lVar22 = lVar20; lVar22 <= lVar21; lVar22 = lVar22 + 1) {
                      lVar45 = lVar22 - lVar20;
                      lVar33 = _DAT_004236f8 + lVar36 * 0x18;
                      if (localSampleCount._data[lVar31 + lVar45] !=
                          *(uint *)(*(long *)(lVar35 * 0x18 + 8 + lVar33) * (lVar29 - local_1b4) * 4
                                    + *(long *)(lVar35 * 0x18 + 0x10 + lVar33) +
                                   (lVar22 - lVar44) * 4)) {
                        __assert_fail("localSampleCount[ty][tx] == sampleCountWhole[ly][lx][dwy][dwx]"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                                      ,0x28d,
                                      "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                     );
                      }
                      lVar33 = 4;
                      lVar25 = (anonymous_namespace)::channelTypes;
                      for (uVar34 = 0; uVar34 < (ulong)(DAT_004236d8 - lVar25 >> 2);
                          uVar34 = uVar34 + 1) {
                        if ((!randomChannels) ||
                           (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar34] == 1)) {
                          iVar9 = *(int *)(lVar25 + uVar34 * 4);
                          if (iVar9 == 0) {
                            pvVar23 = operator_new__((ulong)localSampleCount._data[lVar31 + lVar45]
                                                     << 2);
                            *(void **)(*(long *)((long)data._data + lVar33 * 4 + -8) * lVar37 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar33 * 4) +
                                      lVar45 * 8) = pvVar23;
                            iVar9 = *(int *)((anonymous_namespace)::channelTypes + uVar34 * 4);
                            lVar25 = (anonymous_namespace)::channelTypes;
                          }
                          if (iVar9 == 1) {
                            pvVar23 = operator_new__((ulong)localSampleCount._data[lVar31 + lVar45]
                                                     * 2);
                            *(void **)(*(long *)((long)data._data + lVar33 * 4 + -8) * lVar37 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar33 * 4) +
                                      lVar45 * 8) = pvVar23;
                            lVar25 = (anonymous_namespace)::channelTypes;
                          }
                          if (*(int *)(lVar25 + uVar34 * 4) == 2) {
                            pvVar23 = operator_new__((ulong)localSampleCount._data[lVar31 + lVar45]
                                                     << 2);
                            *(void **)(*(long *)((long)data._data + lVar33 * 4 + -8) * lVar37 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar33 * 4) +
                                      lVar45 * 8) = pvVar23;
                            lVar25 = (anonymous_namespace)::channelTypes;
                          }
                        }
                        lVar33 = lVar33 + 6;
                      }
                      for (lVar33 = 0; lVar38 - lVar33 != 0; lVar33 = lVar33 + 0x18) {
                        pvVar23 = operator_new__((ulong)localSampleCount._data[lVar31 + lVar45] << 2
                                                );
                        uVar34 = (ulong)(DAT_004236d8 - (anonymous_namespace)::channelTypes) >> 2;
                        *(void **)(*(long *)((long)&data._data[uVar34]._sizeY + lVar33) * lVar37 * 8
                                   + *(long *)((long)&data._data[uVar34]._data + lVar33) +
                                  lVar45 * 8) = pvVar23;
                      }
                    }
                  }
                  Imf_2_5::DeepTiledInputFile::readTile(&file,iVar8,local_310,iVar7,iVar46);
                  for (iVar9 = box.min.y; iVar10 = box.min.x, iVar9 <= box.max.y; iVar9 = iVar9 + 1)
                  {
                    for (; iVar10 <= box.max.x; iVar10 = iVar10 + 1) {
                      iVar39 = iVar9 - local_1b4;
                      iVar41 = iVar10 - _ss;
                      lVar24 = (long)iVar9 - (long)box.min.y;
                      iVar32 = (iVar39 * 0x111 + iVar41) % 0x801;
                      fVar48 = (float)iVar32;
                      lVar30 = (long)iVar10 - (long)box.min.x;
                      lVar29 = (anonymous_namespace)::channelTypes;
                      for (uVar34 = 0; uVar34 < (ulong)(DAT_004236d8 - lVar29 >> 2);
                          uVar34 = uVar34 + 1) {
                        if ((!randomChannels) ||
                           (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar34] == 1)) {
                          pvVar23 = data._data[uVar34]._data
                                    [data._data[uVar34]._sizeY * lVar24 + lVar30];
                          iVar27 = *(int *)(lVar29 + uVar34 * 4);
                          uVar6 = localSampleCount._data[localSampleCount._sizeY * lVar24 + lVar30];
                          if ((int)localSampleCount._data[localSampleCount._sizeY * lVar24 + lVar30]
                              < 1) {
                            uVar6 = 0;
                          }
                          for (uVar42 = 0; uVar6 != uVar42; uVar42 = uVar42 + 1) {
                            if (iVar27 == 2) {
                              fVar47 = *(float *)((long)pvVar23 + uVar42 * 4);
                              if ((fVar47 != fVar48) || (NAN(fVar47) || NAN(fVar48))) {
                                poVar19 = (ostream *)std::ostream::operator<<(&std::cout,iVar41);
                                poVar19 = std::operator<<(poVar19,", ");
                                poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar39);
                                poVar19 = std::operator<<(poVar19," error, should be ");
                                poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar32);
                                poVar19 = std::operator<<(poVar19,", is ");
                                poVar19 = (ostream *)
                                          std::ostream::operator<<
                                                    (poVar19,*(float *)((long)pvVar23 + uVar42 * 4))
                                ;
                                std::endl<char,std::char_traits<char>>(poVar19);
                                std::ostream::flush();
                                fVar47 = *(float *)((long)pvVar23 + uVar42 * 4);
                              }
                              if ((fVar47 != fVar48) || (NAN(fVar47) || NAN(fVar48))) {
                                __assert_fail("value[l] == (dwy * width + dwx) % 2049",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                                              ,0x197,
                                              "void (anonymous namespace)::checkValue(void *, int, int, int, int)"
                                             );
                              }
                            }
                            else if (iVar27 == 1) {
                              fVar47 = *(float *)((long)&half::_toFloat +
                                                 (ulong)*(ushort *)((long)pvVar23 + uVar42 * 2) * 4)
                              ;
                              if ((fVar47 != fVar48) || (NAN(fVar47) || NAN(fVar48))) {
                                poVar19 = (ostream *)std::ostream::operator<<(&std::cout,iVar41);
                                poVar19 = std::operator<<(poVar19,", ");
                                poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar39);
                                poVar19 = std::operator<<(poVar19," error, should be ");
                                poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar32);
                                poVar19 = std::operator<<(poVar19,", is ");
                                poVar19 = (ostream *)
                                          ::operator<<(poVar19,(half *)(ulong)*(ushort *)
                                                                               ((long)pvVar23 +
                                                                               uVar42 * 2));
                                std::endl<char,std::char_traits<char>>(poVar19);
                                std::ostream::flush();
                                fVar47 = *(float *)((long)&half::_toFloat +
                                                   (ulong)*(ushort *)((long)pvVar23 + uVar42 * 2) *
                                                   4);
                              }
                              if ((fVar47 != fVar48) || (NAN(fVar47) || NAN(fVar48))) {
                                __assert_fail("value[l] == (dwy * width + dwx) % 2049",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                                              ,0x18e,
                                              "void (anonymous namespace)::checkValue(void *, int, int, int, int)"
                                             );
                              }
                            }
                            else if ((iVar27 == 0) &&
                                    (*(int *)((long)pvVar23 + uVar42 * 4) != iVar32)) {
                              poVar19 = (ostream *)std::ostream::operator<<(&std::cout,iVar41);
                              poVar19 = std::operator<<(poVar19,", ");
                              poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar39);
                              poVar19 = std::operator<<(poVar19," error, should be ");
                              poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar32);
                              poVar19 = std::operator<<(poVar19,", is ");
                              poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
                              std::endl<char,std::char_traits<char>>(poVar19);
                              std::ostream::flush();
                              if (*(int *)((long)pvVar23 + uVar42 * 4) != iVar32) {
                                __assert_fail("value[l] == static_cast<unsigned int>((dwy * width + dwx) % 2049)"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                                              ,0x185,
                                              "void (anonymous namespace)::checkValue(void *, int, int, int, int)"
                                             );
                              }
                            }
                          }
                          iVar27 = *(int *)((anonymous_namespace)::channelTypes + uVar34 * 4);
                          if (iVar27 == 0) {
                            lVar29 = (anonymous_namespace)::channelTypes;
                            if (data._data[uVar34]._data
                                [data._data[uVar34]._sizeY * lVar24 + lVar30] == (void *)0x0)
                            goto LAB_00140ddc;
                            operator_delete__(data._data[uVar34]._data
                                              [data._data[uVar34]._sizeY * lVar24 + lVar30]);
                            iVar27 = *(int *)((anonymous_namespace)::channelTypes + uVar34 * 4);
                          }
                          if (iVar27 == 1) {
                            lVar29 = (anonymous_namespace)::channelTypes;
                            if (data._data[uVar34]._data
                                [data._data[uVar34]._sizeY * lVar24 + lVar30] == (void *)0x0)
                            goto LAB_00140ddc;
                            operator_delete__(data._data[uVar34]._data
                                              [data._data[uVar34]._sizeY * lVar24 + lVar30]);
                            iVar27 = *(int *)((anonymous_namespace)::channelTypes + uVar34 * 4);
                          }
                          lVar29 = (anonymous_namespace)::channelTypes;
                          if ((iVar27 == 2) &&
                             (data._data[uVar34]._data[data._data[uVar34]._sizeY * lVar24 + lVar30]
                              != (void *)0x0)) {
                            operator_delete__(data._data[uVar34]._data
                                              [data._data[uVar34]._sizeY * lVar24 + lVar30]);
                            lVar29 = (anonymous_namespace)::channelTypes;
                          }
                        }
LAB_00140ddc:
                      }
                      for (lVar29 = 0; lVar38 - lVar29 != 0; lVar29 = lVar29 + 0x18) {
                        uVar34 = (ulong)(DAT_004236d8 - (anonymous_namespace)::channelTypes) >> 2;
                        pvVar23 = *(void **)(*(long *)((long)&data._data[uVar34]._sizeY + lVar29) *
                                             lVar24 * 8 +
                                             *(long *)((long)&data._data[uVar34]._data + lVar29) +
                                            lVar30 * 8);
                        if (pvVar23 != (void *)0x0) {
                          operator_delete__(pvVar23);
                        }
                      }
                    }
                  }
                  iVar8 = iVar8 + 1;
                }
              }
            }
            else {
              for (local_34c = 0; iVar8 = Imf_2_5::DeepTiledInputFile::numYTiles(&file,iVar46),
                  local_34c < iVar8; local_34c = local_34c + 1) {
                iVar8 = 0;
                while( true ) {
                  iVar9 = Imf_2_5::DeepTiledInputFile::numXTiles(&file,iVar7);
                  if (iVar9 <= iVar8) break;
                  Imf_2_5::DeepTiledInputFile::readPixelSampleCount
                            (&file,iVar8,local_34c,iVar7,iVar46);
                  Imf_2_5::DeepTiledInputFile::dataWindowForTile
                            ((DeepTiledInputFile *)&box,(int)&file,iVar8,local_34c,iVar7);
                  iVar9 = box.max.y;
                  lVar29 = (long)box.min.x;
                  lVar30 = (long)box.max.x;
                  for (iVar10 = box.min.y; iVar10 <= iVar9; iVar10 = iVar10 + 1) {
                    lVar44 = (long)iVar10 - (long)local_1b4;
                    lVar20 = (long)(int)_ss;
                    lVar21 = localSampleCount._sizeY * lVar44;
                    lVar22 = DAT_004236f0 * local_348;
                    for (lVar24 = lVar29; lVar24 <= lVar30; lVar24 = lVar24 + 1) {
                      lVar36 = lVar24 - lVar20;
                      lVar31 = _DAT_004236f8 + lVar22 * 0x18;
                      if (localSampleCount._data[lVar21 + lVar36] !=
                          *(uint *)(*(long *)(lVar35 * 0x18 + 8 + lVar31) * lVar44 * 4 +
                                    *(long *)(lVar35 * 0x18 + 0x10 + lVar31) + lVar36 * 4)) {
                        __assert_fail("localSampleCount[dwy][dwx] == sampleCountWhole[ly][lx][dwy][dwx]"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                                      ,0x264,
                                      "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                     );
                      }
                      lVar31 = 4;
                      lVar37 = (anonymous_namespace)::channelTypes;
                      for (uVar34 = 0; uVar34 < (ulong)(DAT_004236d8 - lVar37 >> 2);
                          uVar34 = uVar34 + 1) {
                        iVar32 = *(int *)(lVar37 + uVar34 * 4);
                        if (iVar32 == 0) {
                          pvVar23 = operator_new__((ulong)localSampleCount._data[lVar21 + lVar36] <<
                                                   2);
                          *(void **)(*(long *)((long)data._data + lVar31 * 4 + -8) * lVar44 * 8 +
                                     *(long *)((long)&(data._data)->_sizeX + lVar31 * 4) +
                                    lVar36 * 8) = pvVar23;
                          iVar32 = *(int *)((anonymous_namespace)::channelTypes + uVar34 * 4);
                          lVar37 = (anonymous_namespace)::channelTypes;
                        }
                        if (iVar32 == 1) {
                          pvVar23 = operator_new__((ulong)localSampleCount._data[lVar21 + lVar36] *
                                                   2);
                          *(void **)(*(long *)((long)data._data + lVar31 * 4 + -8) * lVar44 * 8 +
                                     *(long *)((long)&(data._data)->_sizeX + lVar31 * 4) +
                                    lVar36 * 8) = pvVar23;
                          iVar32 = *(int *)((anonymous_namespace)::channelTypes + uVar34 * 4);
                          lVar37 = (anonymous_namespace)::channelTypes;
                        }
                        if (iVar32 == 2) {
                          pvVar23 = operator_new__((ulong)localSampleCount._data[lVar21 + lVar36] <<
                                                   2);
                          *(void **)(*(long *)((long)data._data + lVar31 * 4 + -8) * lVar44 * 8 +
                                     *(long *)((long)&(data._data)->_sizeX + lVar31 * 4) +
                                    lVar36 * 8) = pvVar23;
                          lVar37 = (anonymous_namespace)::channelTypes;
                        }
                        lVar31 = lVar31 + 6;
                      }
                      for (lVar31 = 0; lVar38 - lVar31 != 0; lVar31 = lVar31 + 0x18) {
                        pvVar23 = operator_new__((ulong)localSampleCount._data[lVar21 + lVar36] << 2
                                                );
                        uVar34 = (ulong)(DAT_004236d8 - (anonymous_namespace)::channelTypes) >> 2;
                        *(void **)(*(long *)((long)&data._data[uVar34]._sizeY + lVar31) * lVar44 * 8
                                   + *(long *)((long)&data._data[uVar34]._data + lVar31) +
                                  lVar36 * 8) = pvVar23;
                      }
                    }
                  }
                  Imf_2_5::DeepTiledInputFile::readTile(&file,iVar8,local_34c,iVar7,iVar46);
                  iVar8 = iVar8 + 1;
                }
              }
            }
            if (!relativeCoords) {
              lVar29 = 0;
              while( true ) {
                iVar8 = Imf_2_5::DeepTiledInputFile::levelHeight(&file,iVar46);
                iVar9 = (int)lVar29;
                if (iVar8 <= lVar29) break;
                for (lVar30 = 0; iVar8 = Imf_2_5::DeepTiledInputFile::levelWidth(&file,iVar7),
                    lVar30 < iVar8; lVar30 = lVar30 + 1) {
                  iVar8 = (int)lVar30;
                  uVar6 = (uint)(iVar9 * 0x111 + iVar8) % 0x801;
                  fVar48 = (float)uVar6;
                  for (uVar34 = 0; uVar34 != uVar18; uVar34 = uVar34 + 1) {
                    if ((!randomChannels) ||
                       (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar34] == 1)) {
                      for (uVar42 = 0;
                          uVar42 < localSampleCount._data[localSampleCount._sizeY * lVar29 + lVar30]
                          ; uVar42 = uVar42 + 1) {
                        iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar34 * 4);
                        if (iVar10 == 0) {
                          pvVar23 = data._data[uVar34]._data
                                    [data._data[uVar34]._sizeY * lVar29 + lVar30];
                          if (*(uint *)((long)pvVar23 + uVar42 * 4) != uVar6) {
                            poVar19 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
                            poVar19 = std::operator<<(poVar19,", ");
                            poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar9);
                            poVar19 = std::operator<<(poVar19," error, should be ");
                            poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar6);
                            poVar19 = std::operator<<(poVar19,", is ");
                            poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
                            std::endl<char,std::char_traits<char>>(poVar19);
                            std::ostream::flush();
                            if (*(uint *)((long)pvVar23 + uVar42 * 4) != uVar6) {
                              __assert_fail("value[l] == static_cast<unsigned int>(i * width + j) % 2049"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                                            ,0x2d8,
                                            "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                           );
                            }
                          }
                          iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar34 * 4);
                        }
                        if (iVar10 == 1) {
                          ppvVar26 = data._data[uVar34]._data;
                          lVar24 = data._data[uVar34]._sizeY * lVar29;
                          pvVar23 = ppvVar26[lVar24 + lVar30];
                          fVar47 = *(float *)((long)&half::_toFloat +
                                             (ulong)*(ushort *)((long)pvVar23 + uVar42 * 2) * 4);
                          if ((fVar47 != fVar48) || (NAN(fVar47) || NAN(fVar48))) {
                            poVar19 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
                            poVar19 = std::operator<<(poVar19,", ");
                            poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar9);
                            poVar19 = std::operator<<(poVar19," error, should be ");
                            poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar6);
                            poVar19 = std::operator<<(poVar19,", is ");
                            poVar19 = (ostream *)
                                      ::operator<<(poVar19,(half *)(ulong)*(ushort *)
                                                                           ((long)pvVar23 +
                                                                           uVar42 * 2));
                            std::endl<char,std::char_traits<char>>(poVar19);
                            std::ostream::flush();
                            ppvVar26 = data._data[uVar34]._data;
                            lVar24 = data._data[uVar34]._sizeY * lVar29;
                          }
                          fVar47 = *(float *)((long)&half::_toFloat +
                                             (ulong)*(ushort *)
                                                     ((long)ppvVar26[lVar24 + lVar30] + uVar42 * 2)
                                             * 4);
                          if ((fVar47 != fVar48) || (NAN(fVar47) || NAN(fVar48))) {
                            __assert_fail("((half*)(data[k][i][j]))[l] == (i * width + j) % 2049",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                                          ,0x2e1,
                                          "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                         );
                          }
                          iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar34 * 4);
                        }
                        if (iVar10 == 2) {
                          ppvVar26 = data._data[uVar34]._data;
                          lVar24 = data._data[uVar34]._sizeY * lVar29;
                          pvVar23 = ppvVar26[lVar24 + lVar30];
                          fVar47 = *(float *)((long)pvVar23 + uVar42 * 4);
                          if ((fVar47 != fVar48) || (NAN(fVar47) || NAN(fVar48))) {
                            poVar19 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
                            poVar19 = std::operator<<(poVar19,", ");
                            poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar9);
                            poVar19 = std::operator<<(poVar19," error, should be ");
                            poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar6);
                            poVar19 = std::operator<<(poVar19,", is ");
                            poVar19 = (ostream *)
                                      std::ostream::operator<<
                                                (poVar19,*(float *)((long)pvVar23 + uVar42 * 4));
                            std::endl<char,std::char_traits<char>>(poVar19);
                            std::ostream::flush();
                            ppvVar26 = data._data[uVar34]._data;
                            lVar24 = data._data[uVar34]._sizeY * lVar29;
                          }
                          fVar47 = *(float *)((long)ppvVar26[lVar24 + lVar30] + uVar42 * 4);
                          if ((fVar47 != fVar48) || (NAN(fVar47) || NAN(fVar48))) {
                            __assert_fail("((float*)(data[k][i][j]))[l] == (i * width + j) % 2049",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                                          ,0x2ea,
                                          "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                         );
                          }
                        }
                      }
                    }
                  }
                }
                lVar29 = lVar29 + 1;
              }
              for (lVar29 = 0; iVar8 = Imf_2_5::DeepTiledInputFile::levelHeight(&file,iVar46),
                  lVar29 < iVar8; lVar29 = lVar29 + 1) {
                for (lVar30 = 0; iVar8 = Imf_2_5::DeepTiledInputFile::levelWidth(&file,iVar7),
                    lVar30 < iVar8; lVar30 = lVar30 + 1) {
                  lVar24 = 4;
                  for (uVar34 = 0; uVar18 != uVar34; uVar34 = uVar34 + 1) {
                    iVar8 = *(int *)((anonymous_namespace)::channelTypes + uVar34 * 4);
                    if (iVar8 == 0) {
                      pvVar23 = *(void **)(*(long *)((long)data._data + lVar24 * 4 + -8) * lVar29 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar24 * 4) +
                                          lVar30 * 8);
                      if (pvVar23 != (void *)0x0) {
                        operator_delete__(pvVar23);
                        iVar8 = *(int *)((anonymous_namespace)::channelTypes + uVar34 * 4);
                        goto LAB_001415b7;
                      }
                    }
                    else {
LAB_001415b7:
                      if (iVar8 == 1) {
                        pvVar23 = *(void **)(*(long *)((long)data._data + lVar24 * 4 + -8) * lVar29
                                             * 8 + *(long *)((long)&(data._data)->_sizeX +
                                                            lVar24 * 4) + lVar30 * 8);
                        if (pvVar23 == (void *)0x0) goto LAB_00141614;
                        operator_delete__(pvVar23);
                        iVar8 = *(int *)((anonymous_namespace)::channelTypes + uVar34 * 4);
                      }
                      if ((iVar8 == 2) &&
                         (pvVar23 = *(void **)(*(long *)((long)data._data + lVar24 * 4 + -8) *
                                               lVar29 * 8 +
                                               *(long *)((long)&(data._data)->_sizeX + lVar24 * 4) +
                                              lVar30 * 8), pvVar23 != (void *)0x0)) {
                        operator_delete__(pvVar23);
                      }
                    }
LAB_00141614:
                    lVar24 = lVar24 + 6;
                  }
                  for (lVar24 = 0; lVar38 - lVar24 != 0; lVar24 = lVar24 + 0x18) {
                    uVar34 = (ulong)(DAT_004236d8 - (anonymous_namespace)::channelTypes) >> 2;
                    pvVar23 = *(void **)(*(long *)((long)&data._data[uVar34]._sizeY + lVar24) *
                                         lVar29 * 8 +
                                         *(long *)((long)&data._data[uVar34]._data + lVar24) +
                                        lVar30 * 8);
                    if (pvVar23 != (void *)0x0) {
                      operator_delete__(pvVar23);
                    }
                  }
                }
              }
            }
            lVar35 = lVar35 + 1;
          }
        }
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&read_channel.super__Vector_base<int,_std::allocator<int>_>);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
                   *)&frameBuffer);
      Imf_2_5::Array<Imf_2_5::Array2D<void_*>_>::~Array(&data);
      Imf_2_5::Array2D<unsigned_int>::~Array2D(&localSampleCount);
      Imf_2_5::DeepTiledInputFile::~DeepTiledInputFile(&file);
      return;
    }
    if (randomChannels) {
      iVar7 = random_int(2);
      read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar34] = iVar7;
      if (iVar7 == 1) goto LAB_0014010f;
    }
    else {
LAB_0014010f:
      PVar3 = *(PixelType *)((anonymous_namespace)::channelTypes + uVar34 * 4);
      t = (uint)(PVar3 != UINT) * 3;
      if (PVar3 == HALF) {
        t = PVar3;
      }
      if (PVar3 == FLOAT) {
        t = PVar3;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1a8,(int)uVar34);
      std::__cxx11::stringbuf::str();
      iVar7 = *(int *)((anonymous_namespace)::channelTypes + uVar34 * 4);
      spst = (ulong)(iVar7 == 0) << 2;
      if (iVar7 == 1) {
        spst = 2;
      }
      if (iVar7 == 2) {
        spst = 4;
      }
      Imf_2_5::DeepSlice::DeepSlice
                ((DeepSlice *)&box,t,
                 (char *)(*(long *)((long)&(data._data)->_sizeX + lVar35) + lVar38 * -8),8,0x888,
                 spst,1,1,0.0,relativeCoords,relativeCoords);
      Imf_2_5::DeepFrameBuffer::insert(&frameBuffer,&str,(DeepSlice *)&box);
      iVar46 = iVar46 + 1;
      std::__cxx11::string::~string((string *)&str);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    }
    uVar34 = uVar34 + 1;
    lVar35 = lVar35 + 0x18;
  } while( true );
}

Assistant:

void readFile (int channelCount,
               bool bulkRead,
               bool relativeCoords,
               bool randomChannels,
               const std::string & filename)
{
    if (relativeCoords)
        assert(bulkRead == false);

    cout << "reading " << flush;

    DeepTiledInputFile file (filename.c_str(), 4);

    const Header& fileHeader = file.header();
    assert (fileHeader.displayWindow() == header.displayWindow());
    assert (fileHeader.dataWindow() == header.dataWindow());
    assert (fileHeader.pixelAspectRatio() == header.pixelAspectRatio());
    assert (fileHeader.screenWindowCenter() == header.screenWindowCenter());
    assert (fileHeader.screenWindowWidth() == header.screenWindowWidth());
    assert (fileHeader.lineOrder() == header.lineOrder());
    assert (fileHeader.compression() == header.compression());
    assert (fileHeader.channels() == header.channels());
    assert (fileHeader.type() == header.type());
    assert (fileHeader.tileDescription() == header.tileDescription());

    Array2D<unsigned int> localSampleCount;
    localSampleCount.resizeErase(height, width);
    
    // also test filling channels. Generate up to 2 extra channels
    int fillChannels=random_int(3);
    
    Array<Array2D< void* > > data(channelCount+fillChannels);
    for (int i = 0; i < channelCount+fillChannels; i++)
        data[i].resizeErase(height, width);

    DeepFrameBuffer frameBuffer;

    int memOffset;
    if (relativeCoords)
        memOffset = 0;
    else
        memOffset = dataWindow.min.x + dataWindow.min.y * width;
    frameBuffer.insertSampleCountSlice (Slice (IMF::UINT,
                                        (char *) (&localSampleCount[0][0] - memOffset),
                                        sizeof (unsigned int) * 1,
                                        sizeof (unsigned int) * width,
                                        1, 1,
                                        0,
                                        relativeCoords,
                                        relativeCoords));

    
    vector<int> read_channel(channelCount);
    int channels_added=0;
    for (int i = 0; i < channelCount; i++)
    {
         if(randomChannels)
        {
	     read_channel[i] = random_int(2);
	     
        }
        if(!randomChannels || read_channel[i]==1)
        {
            PixelType type = IMF::NUM_PIXELTYPES;
            if (channelTypes[i] == 0)
                type = IMF::UINT;
            if (channelTypes[i] == 1)
                type = IMF::HALF;
            if (channelTypes[i] == 2)
                type = IMF::FLOAT;

            stringstream ss;
            ss << i;
            string str = ss.str();

            int sampleSize = 0;
            if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
            if (channelTypes[i] == 1) sampleSize = sizeof (half);
            if (channelTypes[i] == 2) sampleSize = sizeof (float);

            int pointerSize = sizeof (char *);

            frameBuffer.insert (str,
                                DeepSlice (type,
                                (char *) (&data[i][0][0] - memOffset),
                                pointerSize * 1,
                                pointerSize * width,
                                sampleSize,
                                1, 1,
                                0,
                                relativeCoords,
                                relativeCoords));
                channels_added++;
            }
    }
     if(channels_added==0)
    {
      cout << "skipping " <<flush;
      return;
    }
    for(int i = 0 ; i < fillChannels ; ++i )
    { 
        PixelType type  = IMF::FLOAT;
        int sampleSize = sizeof(float);            
        int pointerSize = sizeof (char *);
        stringstream ss;
        // generate channel names that aren't in file but (might) interleave with existing file
        ss << i << "fill";
        string str = ss.str();
        frameBuffer.insert (str,
                            DeepSlice (type,
                            (char *) (&data[i+channelCount][0][0] - memOffset),
                            pointerSize * 1,
                            pointerSize * width,
                            sampleSize,
                            1, 1,
                            0,
                            relativeCoords,
                            relativeCoords));
    }

    file.setFrameBuffer(frameBuffer);

    if (bulkRead)
        cout << "bulk " << flush;
    else
    {
        if (relativeCoords == false)
            cout << "per-tile " << flush;
        else
            cout << "per-tile with relative coordinates " << flush;
    }

    for (int ly = 0; ly < file.numYLevels(); ly++)
        for (int lx = 0; lx < file.numXLevels(); lx++)
        {
            Box2i dataWindowL = file.dataWindowForLevel(lx, ly);

            if (bulkRead)
            {
                //
                // Testing bulk read (without relative coordinates).
                //

                file.readPixelSampleCounts(0, file.numXTiles(lx) - 1, 0, file.numYTiles(ly) - 1, lx, ly);

                for (int i = 0; i < file.numYTiles(ly); i++)
                {
                    for (int j = 0; j < file.numXTiles(lx); j++)
                    {
                        Box2i box = file.dataWindowForTile(j, i, lx, ly);
                        for (int y = box.min.y; y <= box.max.y; y++)
                            for (int x = box.min.x; x <= box.max.x; x++)
                            {
                                int dwy = y - dataWindowL.min.y;
                                int dwx = x - dataWindowL.min.x;
                                assert(localSampleCount[dwy][dwx] == sampleCountWhole[ly][lx][dwy][dwx]);

                                for (size_t k = 0; k < channelTypes.size(); k++)
                                {
                                    if (channelTypes[k] == 0)
                                        data[k][dwy][dwx] = new unsigned int[localSampleCount[dwy][dwx]];
                                    if (channelTypes[k] == 1)
                                        data[k][dwy][dwx] = new half[localSampleCount[dwy][dwx]];
                                    if (channelTypes[k] == 2)
                                        data[k][dwy][dwx] = new float[localSampleCount[dwy][dwx]];
                                }
                                
                                for( int f = 0 ; f < fillChannels ; ++f )
                                {
                                     data[f + channelTypes.size()][dwy][dwx] = new float[localSampleCount[dwy][dwx]];
                                }
                                
                            }
                            
                    }
                }

                file.readTiles(0, file.numXTiles(lx) - 1, 0, file.numYTiles(ly) - 1, lx, ly);
            }
            else if (bulkRead == false)
            {
                if (relativeCoords == false)
                {
                    //
                    // Testing per-tile read without relative coordinates.
                    //

                    for (int i = 0; i < file.numYTiles(ly); i++)
                    {
                        for (int j = 0; j < file.numXTiles(lx); j++)
                        {
                            file.readPixelSampleCount(j, i, lx, ly);

                            Box2i box = file.dataWindowForTile(j, i, lx, ly);
                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    assert(localSampleCount[dwy][dwx] == sampleCountWhole[ly][lx][dwy][dwx]);

                                    for (size_t k = 0; k < channelTypes.size(); k++)
                                    {
                                        if (channelTypes[k] == 0)
                                            data[k][dwy][dwx] = new unsigned int[localSampleCount[dwy][dwx]];
                                        if (channelTypes[k] == 1)
                                            data[k][dwy][dwx] = new half[localSampleCount[dwy][dwx]];
                                        if (channelTypes[k] == 2)
                                            data[k][dwy][dwx] = new float[localSampleCount[dwy][dwx]];
                                    }
                                    for( int f = 0 ; f < fillChannels ; ++f )
                                    {
                                       data[f + channelTypes.size()][dwy][dwx] = new float[localSampleCount[dwy][dwx]];
                                    }
                                }

                            file.readTile(j, i, lx, ly);
                        }
                    }
                }
                else if (relativeCoords)
                {
                    //
                    // Testing per-tile read with relative coordinates.
                    //

                    for (int i = 0; i < file.numYTiles(ly); i++)
                    {
                        for (int j = 0; j < file.numXTiles(lx); j++)
                        {
                            file.readPixelSampleCount(j, i, lx, ly);

                            Box2i box = file.dataWindowForTile(j, i, lx, ly);
                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    int ty = y - box.min.y;
                                    int tx = x - box.min.x;
                                    assert(localSampleCount[ty][tx] == sampleCountWhole[ly][lx][dwy][dwx]);

                                    for (size_t k = 0; k < channelTypes.size(); k++)
                                    {
                                          if( !randomChannels || read_channel[k]==1)
                                          {
                                                if (channelTypes[k] == 0)
                                                    data[k][ty][tx] = new unsigned int[localSampleCount[ty][tx]];
                                                if (channelTypes[k] == 1)
                                                    data[k][ty][tx] = new half[localSampleCount[ty][tx]];
                                                if (channelTypes[k] == 2)
                                                    data[k][ty][tx] = new float[localSampleCount[ty][tx]];
                                          }
                                            
                                         
                                    }
                                    for( int f = 0 ; f < fillChannels ; ++f )
                                    {
                                        data[f + channelTypes.size()][ty][tx] = new float[localSampleCount[ty][tx]];
                                    }
                                }

                            file.readTile(j, i, lx, ly);

                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    int ty = y - box.min.y;
                                    int tx = x - box.min.x;

                                    for (size_t k = 0; k < channelTypes.size(); k++)
                                    {
                                         if( !randomChannels || read_channel[k]==1)
                                         {
                                                checkValue(data[k][ty][tx],
                                                        localSampleCount[ty][tx],
                                                        channelTypes[k],
                                                        dwx, dwy);
                                                if (channelTypes[k] == 0)
                                                    delete[] (unsigned int*) data[k][ty][tx];
                                                if (channelTypes[k] == 1)
                                                    delete[] (half*) data[k][ty][tx];
                                                if (channelTypes[k] == 2)
                                                    delete[] (float*) data[k][ty][tx];
                                         }
                                    }
                                    for( int f = 0 ; f < fillChannels ; ++f )
                                    {
                                         delete[] (float*) data[f+channelTypes.size()][ty][tx];
                                    }
                                }
                        }
                    }
                }
            }

            if (relativeCoords == false)
            {
                for (int i = 0; i < file.levelHeight(ly); i++)
                    for (int j = 0; j < file.levelWidth(lx); j++)
                        for (int k = 0; k < channelCount; k++)
                        {
                            if( !randomChannels || read_channel[k]==1)
                            {
                                for (unsigned int l = 0; l < localSampleCount[i][j]; l++)
                                {
                                    if (channelTypes[k] == 0)
                                    {
                                        unsigned int* value = (unsigned int*)(data[k][i][j]);
                                        if (value[l] != static_cast<unsigned int>(i * width + j) % 2049)
                                            cout << j << ", " << i << " error, should be "
                                                << (i * width + j) % 2049 << ", is " << value[l]
                                                << endl << flush;
                                        assert (value[l] == static_cast<unsigned int>(i * width + j) % 2049);
                                    }
                                    if (channelTypes[k] == 1)
                                    {
                                        half* value = (half*)(data[k][i][j]);
                                        if (value[l] != (i * width + j) % 2049)
                                            cout << j << ", " << i << " error, should be "
                                                << (i * width + j) % 2049 << ", is " << value[l]
                                                << endl << flush;
                                        assert (((half*)(data[k][i][j]))[l] == (i * width + j) % 2049);
                                    }
                                    if (channelTypes[k] == 2)
                                    {
                                        float* value = (float*)(data[k][i][j]);
                                        if (value[l] != (i * width + j) % 2049)
                                            cout << j << ", " << i << " error, should be "
                                                << (i * width + j) % 2049 << ", is " << value[l]
                                                << endl << flush;
                                        assert (((float*)(data[k][i][j]))[l] == (i * width + j) % 2049);
                                    }
                                }
                            }
                        }

                for (int i = 0; i < file.levelHeight(ly); i++)
                    for (int j = 0; j < file.levelWidth(lx); j++)
                    {
                        for (int k = 0; k < channelCount; k++)
                        {
                                if (channelTypes[k] == 0)
                                    delete[] (unsigned int*) data[k][i][j];
                                if (channelTypes[k] == 1)
                                    delete[] (half*) data[k][i][j];
                                if (channelTypes[k] == 2)
                                    delete[] (float*) data[k][i][j];
                        }
                        for( int f = 0 ; f < fillChannels ; ++f )
                        {
                            delete[] (float*) data[f+channelTypes.size()][i][j];
                        }
                    }
            }
        }
}